

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_pair(runtime_type *this,var *a,var *b)

{
  bool bVar1;
  runtime_error *this_00;
  proxy *in_RDI;
  string *in_stack_ffffffffffffff58;
  type_info *in_stack_ffffffffffffff60;
  EVP_PKEY_CTX *src;
  proxy *args;
  allocator local_71;
  string local_70 [32];
  EVP_PKEY_CTX local_50 [8];
  EVP_PKEY_CTX local_48 [24];
  EVP_PKEY_CTX local_30 [8];
  EVP_PKEY_CTX local_28 [40];
  
  args = in_RDI;
  cs_impl::any::type((any *)in_stack_ffffffffffffff60);
  bVar1 = std::type_info::operator!=
                    (in_stack_ffffffffffffff60,(type_info *)in_stack_ffffffffffffff58);
  if (bVar1) {
    cs_impl::any::type((any *)in_stack_ffffffffffffff60);
    bVar1 = std::type_info::operator!=
                      (in_stack_ffffffffffffff60,(type_info *)in_stack_ffffffffffffff58);
    if (bVar1) {
      src = local_30;
      cs_impl::any::any((any *)in_stack_ffffffffffffff60,(any *)in_stack_ffffffffffffff58);
      copy(local_28,src);
      cs_impl::any::any((any *)in_stack_ffffffffffffff60,(any *)in_stack_ffffffffffffff58);
      copy(local_48,local_50);
      cs_impl::any::make<std::pair<cs_impl::any,cs_impl::any>,cs_impl::any,cs_impl::any>
                ((any *)args,(any *)src);
      cs_impl::any::~any((any *)0x51cb11);
      cs_impl::any::~any((any *)0x51cb1b);
      cs_impl::any::~any((any *)0x51cb28);
      cs_impl::any::~any((any *)0x51cb32);
      return (var)in_RDI;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Unsupported operator operations(Pair).",&local_71);
  runtime_error::runtime_error(this_00,in_stack_ffffffffffffff58);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_pair(const var &a, const var &b)
	{
		if (a.type() != typeid(pair) && b.type() != typeid(pair))
			return var::make<pair>(copy(a), copy(b));
		else
			throw runtime_error("Unsupported operator operations(Pair).");
	}